

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CENamespace.cpp
# Opt level: O0

string * CppEphem::StrOpt::join<std::__cxx11::string>
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *values,char *delim)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  char *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  string *in_RDI;
  int i;
  ostringstream ss;
  int local_1a0;
  ostringstream local_190 [376];
  char *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_10);
  if (sVar1 != 0) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_10,0);
    std::operator<<((ostream *)local_190,(string *)pvVar2);
  }
  local_1a0 = 1;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_10);
    if (sVar1 <= (ulong)(long)local_1a0) break;
    poVar3 = std::operator<<((ostream *)local_190,*local_18);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_10,(long)local_1a0);
    std::operator<<(poVar3,(string *)pvVar2);
    local_1a0 = local_1a0 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string CppEphem::StrOpt::join(const std::vector<T>& values,
                                   const char&           delim)
{
    // Assemble the first value in the string
    std::ostringstream ss;
    if (values.size() > 0) {
        ss << values[0];
    }

    // Now append the rest
    for (int i=1; i<values.size(); i++) { 
        ss << delim << values[i];
    }

    return ss.str();
}